

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

bool __thiscall re2::Compiler::IsCachedRuneByteSuffix(Compiler *this,int id)

{
  Inst *pIVar1;
  iterator iVar2;
  uint64_t key;
  ulong local_8;
  
  pIVar1 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
           super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
  local_8 = ((ulong)pIVar1[id].field_1.field_3.lo_ << 9 |
            (ulong)(pIVar1[id].out_opcode_ >> 4) << 0x11) +
            (ulong)pIVar1[id].field_1.field_3.hi_ * 2 |
            (ulong)(pIVar1[id].field_1.field_3.hint_foldcase_ & 1);
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->rune_cache_)._M_h,&local_8);
  return iVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_int>,_false>._M_cur !=
         (__node_type *)0x0;
}

Assistant:

bool Compiler::IsCachedRuneByteSuffix(int id) {
  uint8_t lo = inst_[id].lo_;
  uint8_t hi = inst_[id].hi_;
  bool foldcase = inst_[id].foldcase() != 0;
  int next = inst_[id].out();

  uint64_t key = MakeRuneCacheKey(lo, hi, foldcase, next);
  return rune_cache_.find(key) != rune_cache_.end();
}